

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_malloc.c
# Opt level: O2

void ga_free(void *ptr)

{
  Boolean BVar1;
  
  if (ga_usesMA == 0) {
    (*ga_ext_free)((void *)((long)ptr + (-0x10 - *(Integer *)((long)ptr + -0x10))));
    return;
  }
  BVar1 = MA_pop_stack(*(Integer *)((long)ptr + -0x10));
  if (BVar1 != 0) {
    return;
  }
  pnga_error("ga_free: MA_pop_stack failed",0);
  return;
}

Assistant:

void ga_free(void *ptr)
{
    Integer handle;
    ptr = ((char*)ptr)-ALIGNMENT;
    handle= *((Integer*)ptr); /* retreive handle */

    if(ga_usesMA) {
      if(!MA_pop_stack(handle)) pnga_error("ga_free: MA_pop_stack failed",0);}
    else /*make sure to free original(before address alignment) pointer*/
      (*ga_ext_free)((char *)ptr - handle);
}